

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O2

void google::protobuf::
     STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptorProto_const**,std::vector<google::protobuf::FileDescriptorProto_const*,std::allocator<google::protobuf::FileDescriptorProto_const*>>>>
               (__normal_iterator<const_google::protobuf::FileDescriptorProto_**,_std::vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>_>
                begin,__normal_iterator<const_google::protobuf::FileDescriptorProto_**,_std::vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>_>
                      end)

{
  FileDescriptorProto *pFVar1;
  
  while (begin._M_current != end._M_current) {
    pFVar1 = *begin._M_current;
    begin._M_current = begin._M_current + 1;
    if (pFVar1 != (FileDescriptorProto *)0x0) {
      (*(pFVar1->super_Message).super_MessageLite._vptr_MessageLite[1])();
    }
  }
  return;
}

Assistant:

void STLDeleteContainerPointers(ForwardIterator begin,
                                ForwardIterator end) {
  while (begin != end) {
    ForwardIterator temp = begin;
    ++begin;
    delete *temp;
  }
}